

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O2

void EOPLL_calcStereo(EOPLL *opll,int32_t *out)

{
  double dVar1;
  byte bVar2;
  int iVar3;
  int32_t iVar4;
  long lVar5;
  int data;
  
  while( true ) {
    dVar1 = opll->out_time;
    if (opll->out_step <= dVar1) break;
    opll->out_time = dVar1 + opll->inp_step;
    update_output(opll);
    opll->mix_out[0] = 0;
    opll->mix_out[1] = 0;
    iVar3 = 0;
    data = 0;
    for (lVar5 = -0xe; lVar5 != 0; lVar5 = lVar5 + 1) {
      bVar2 = opll->pan[lVar5 + 0xe];
      if ((bVar2 & 2) != 0) {
        data = data + ((int)*(short *)((long)opll->mix_out + lVar5 * 2) *
                       opll->pan_fine[lVar5 + 0xe][0] >> 0x10);
        opll->mix_out[0] = data;
        bVar2 = opll->pan[lVar5 + 0xe];
      }
      if ((bVar2 & 1) != 0) {
        iVar3 = iVar3 + ((int)*(short *)((long)opll->mix_out + lVar5 * 2) *
                         opll->pan_fine[lVar5 + 0xe][1] >> 0x10);
        opll->mix_out[1] = iVar3;
      }
    }
    if (opll->conv != (EOPLL_RateConv *)0x0) {
      EOPLL_RateConv_putData(opll->conv,0,data);
      EOPLL_RateConv_putData(opll->conv,1,opll->mix_out[1]);
    }
  }
  opll->out_time = dVar1 - opll->out_step;
  if (opll->conv == (EOPLL_RateConv *)0x0) {
    *out = opll->mix_out[0];
    iVar4 = opll->mix_out[1];
  }
  else {
    iVar4 = EOPLL_RateConv_getData(opll->conv,0);
    *out = iVar4;
    iVar4 = EOPLL_RateConv_getData(opll->conv,1);
  }
  out[1] = iVar4;
  return;
}

Assistant:

void EOPLL_calcStereo(EOPLL *opll, int32_t out[2]) {
  while (opll->out_step > opll->out_time) {
    opll->out_time += opll->inp_step;
    update_output(opll);
    mix_output_stereo(opll);
  }
  opll->out_time -= opll->out_step;
  if (opll->conv) {
    out[0] = EOPLL_RateConv_getData(opll->conv, 0);
    out[1] = EOPLL_RateConv_getData(opll->conv, 1);
  } else {
    out[0] = opll->mix_out[0];
    out[1] = opll->mix_out[1];
  }
}